

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_stor_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  ftp_conn *ftpc;
  connectdata *pcStack_30;
  _Bool connected;
  connectdata *conn;
  ftpstate local_1d;
  CURLcode result;
  ftpstate instate_local;
  Curl_easy *pCStack_18;
  int ftpcode_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pcStack_30 = data->conn;
  local_1d = instate;
  result = ftpcode;
  pCStack_18 = data;
  if (ftpcode < 400) {
    (pcStack_30->proto).ftpc.state_saved = instate;
    if ((*(ulong *)&(data->set).field_0x8ca >> 0xc & 1) == 0) {
      data_local._4_4_ = InitiateTransfer(data);
    }
    else {
      _ftp_state(data,'\0');
      conn._4_4_ = AllowServerConnect(pCStack_18,(_Bool *)((long)&ftpc + 7));
      pcVar1 = pcStack_30;
      data_local._4_4_ = conn._4_4_;
      if (conn._4_4_ == CURLE_OK) {
        if ((ftpc._7_1_ & 1) == 0) {
          if (((pCStack_18 != (Curl_easy *)0x0) &&
              ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0)) &&
             (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((pCStack_18->state).feat)->log_level)))) {
            Curl_infof(pCStack_18,"Data conn was not available immediately");
          }
          *(byte *)((long)&pcVar1->proto + 0x112) =
               *(byte *)((long)&pcVar1->proto + 0x112) & 0xdf | 0x20;
        }
        data_local._4_4_ = CURLE_OK;
      }
    }
  }
  else {
    Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    _ftp_state(pCStack_18,'\0');
    data_local._4_4_ = CURLE_UPLOAD_FAILED;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct Curl_easy *data,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode >= 400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    ftp_state(data, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    bool connected;

    ftp_state(data, FTP_STOP); /* no longer in STOR state */

    result = AllowServerConnect(data, &connected);
    if(result)
      return result;

    if(!connected) {
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      infof(data, "Data conn was not available immediately");
      ftpc->wait_data_conn = TRUE;
    }

    return CURLE_OK;
  }
  return InitiateTransfer(data);
}